

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

TriggerPrg * getRowTrigger(Parse *pParse,Trigger *pTrigger,Table *pTab,int orconf)

{
  u8 uVar1;
  sqlite3 *psVar2;
  Op *pOVar3;
  int iVar4;
  Parse *pPVar5;
  TriggerPrg *pTVar6;
  SubProgram *pSVar7;
  Vdbe *pVVar8;
  char *pcVar9;
  Expr *pEVar10;
  SrcList *pSVar11;
  IdList *pColumn;
  Upsert *pUpsert;
  Select *pSVar12;
  ExprList *pEVar13;
  Expr *in_R8;
  TriggerStep *pStep;
  undefined4 in_stack_fffffffffffffd88;
  Upsert *pUpsert_00;
  undefined1 local_228 [24];
  char *local_210;
  undefined1 local_200 [24];
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  Parse local_1c8;
  
  pPVar5 = pParse->pToplevel;
  if (pParse->pToplevel == (Parse *)0x0) {
    pPVar5 = pParse;
  }
  for (pTVar6 = pPVar5->pTriggerPrg; pTVar6 != (TriggerPrg *)0x0; pTVar6 = pTVar6->pNext) {
    if ((pTVar6->pTrigger == pTrigger) && (pTVar6->orconf == orconf)) {
      return pTVar6;
    }
  }
  psVar2 = pParse->db;
  pTVar6 = (TriggerPrg *)sqlite3DbMallocZero(psVar2,0x28);
  if (pTVar6 != (TriggerPrg *)0x0) {
    pTVar6->pNext = pPVar5->pTriggerPrg;
    pPVar5->pTriggerPrg = pTVar6;
    pSVar7 = (SubProgram *)sqlite3DbMallocZero(psVar2,0x30);
    pTVar6->pProgram = pSVar7;
    if (pSVar7 != (SubProgram *)0x0) {
      pVVar8 = pPVar5->pVdbe;
      pSVar7->pNext = pVVar8->pProgram;
      pVVar8->pProgram = pSVar7;
      pTVar6->pTrigger = pTrigger;
      pTVar6->orconf = orconf;
      pTVar6->aColmask[0] = 0xffffffff;
      pTVar6->aColmask[1] = 0xffffffff;
      memset(&local_1c8.zErrMsg,0,0xd0);
      memset(&local_1c8.sLastToken,0,0x88);
      local_1c8.pOuterParse = psVar2->pParse;
      local_200._0_8_ = &local_1c8;
      psVar2->pParse = (Parse *)local_200._0_8_;
      local_1c8.db = psVar2;
      if (psVar2->mallocFailed != '\0') {
        sqlite3ErrorMsg(&local_1c8,"out of memory");
      }
      local_1d8 = (undefined1  [16])0x0;
      local_1e8 = (undefined1  [16])0x0;
      local_200._8_16_ = (undefined1  [16])0x0;
      local_1c8.zAuthContext = pTrigger->zName;
      local_1c8.eTriggerOp = pTrigger->op;
      local_1c8.nQueryLoop = pParse->nQueryLoop;
      local_1c8.disableVtab = pParse->disableVtab;
      local_1c8.pToplevel = pPVar5;
      local_1c8.pTriggerTab = pTab;
      pVVar8 = sqlite3GetVdbe((Parse *)local_200._0_8_);
      if (pVVar8 == (Vdbe *)0x0) {
        if (pParse->nErr == 0) {
          pParse->zErrMsg = local_1c8.zErrMsg;
          pParse->nErr = local_1c8.nErr;
          pParse->rc = local_1c8.rc;
        }
        else if (local_1c8.zErrMsg != (char *)0x0) {
          sqlite3DbFreeNN(local_1c8.db,local_1c8.zErrMsg);
        }
      }
      else {
        if (pTrigger->zName != (char *)0x0) {
          pcVar9 = sqlite3MPrintf(psVar2,"-- TRIGGER %s");
          sqlite3VdbeChangeP4(pVVar8,-1,pcVar9,-6);
        }
        if (pTrigger->pWhen == (Expr *)0x0) {
          pUpsert_00 = (Upsert *)0x0;
        }
        else {
          pUpsert_00 = (Upsert *)0x0;
          pEVar10 = exprDup(psVar2,pTrigger->pWhen,0,(u8 **)0x0);
          if ((psVar2->mallocFailed == '\0') &&
             (iVar4 = sqlite3ResolveExprNames((NameContext *)local_200,pEVar10), iVar4 == 0)) {
            local_1c8.nLabel = local_1c8.nLabel - 1;
            pUpsert_00 = (Upsert *)(ulong)(uint)local_1c8.nLabel;
            sqlite3ExprIfFalse(&local_1c8,pEVar10,local_1c8.nLabel,0x10);
          }
          if (pEVar10 != (Expr *)0x0) {
            sqlite3ExprDeleteNN(psVar2,pEVar10);
          }
        }
        psVar2 = local_1c8.db;
        pStep = pTrigger->step_list;
        if (pStep != (TriggerStep *)0x0) {
          do {
            pEVar13 = (ExprList *)(ulong)(uint)orconf;
            local_1c8.eOrconf = (u8)orconf;
            if (orconf == 0xb) {
              local_1c8.eOrconf = pStep->orconf;
            }
            if (pStep->zSpan != (char *)0x0) {
              pcVar9 = sqlite3MPrintf(psVar2,"-- %s");
              in_R8 = (Expr *)0x0;
              iVar4 = sqlite3VdbeAddOp3(local_1c8.pVdbe,0xb5,0x7fffffff,1,0);
              pEVar13 = (ExprList *)0xfffffffa;
              sqlite3VdbeChangeP4(local_1c8.pVdbe,iVar4,pcVar9,-6);
            }
            uVar1 = pStep->op;
            if (uVar1 == '\x7f') {
              pSVar11 = sqlite3TriggerStepSrc(&local_1c8,pStep);
              pSVar12 = sqlite3SelectDup(psVar2,pStep->pSelect,0);
              pColumn = sqlite3IdListDup(psVar2,pStep->pIdList);
              uVar1 = local_1c8.eOrconf;
              pUpsert = sqlite3UpsertDup(psVar2,pStep->pUpsert);
              sqlite3Insert(&local_1c8,pSVar11,pSVar12,pColumn,(uint)uVar1,pUpsert);
LAB_0018fd7d:
              in_R8 = (Expr *)0x0;
              sqlite3VdbeAddOp3(local_1c8.pVdbe,0x83,0,0,0);
            }
            else {
              if (uVar1 == 0x80) {
                pSVar11 = sqlite3TriggerStepSrc(&local_1c8,pStep);
                if (pStep->pWhere == (Expr *)0x0) {
                  pEVar10 = (Expr *)0x0;
                }
                else {
                  pEVar13 = (ExprList *)0x0;
                  pEVar10 = exprDup(psVar2,pStep->pWhere,0,(u8 **)0x0);
                }
                sqlite3DeleteFrom(&local_1c8,pSVar11,pEVar10,pEVar13,in_R8);
                goto LAB_0018fd7d;
              }
              if (uVar1 == 0x81) {
                pSVar11 = sqlite3TriggerStepSrc(&local_1c8,pStep);
                pEVar13 = sqlite3ExprListDup(psVar2,pStep->pExprList,0);
                if (pStep->pWhere == (Expr *)0x0) {
                  pEVar10 = (Expr *)0x0;
                }
                else {
                  pEVar10 = exprDup(psVar2,pStep->pWhere,0,(u8 **)0x0);
                }
                sqlite3Update(&local_1c8,pSVar11,pEVar13,pEVar10,(uint)local_1c8.eOrconf,
                              (ExprList *)0x0,(Expr *)CONCAT44(orconf,in_stack_fffffffffffffd88),
                              pUpsert_00);
                goto LAB_0018fd7d;
              }
              pSVar12 = sqlite3SelectDup(psVar2,pStep->pSelect,0);
              local_228[0] = '\x04';
              local_210 = (char *)0x0;
              local_228._4_16_ = (undefined1  [16])0x0;
              sqlite3Select(&local_1c8,pSVar12,(SelectDest *)local_228);
              if (pSVar12 != (Select *)0x0) {
                clearSelect(psVar2,pSVar12,1);
              }
            }
            pStep = pStep->pNext;
          } while (pStep != (TriggerStep *)0x0);
        }
        if ((int)pUpsert_00 != 0) {
          sqlite3VdbeResolveLabel(pVVar8,(int)pUpsert_00);
        }
        sqlite3VdbeAddOp3(pVVar8,0x46,0,0,0);
        if (pParse->nErr == 0) {
          pParse->zErrMsg = local_1c8.zErrMsg;
          pParse->nErr = local_1c8.nErr;
          pParse->rc = local_1c8.rc;
LAB_0018fe13:
          if (local_1c8.nErr == 0) {
            pOVar3 = pVVar8->aOp;
            resolveP2Values(pVVar8,&pPVar5->nMaxArg);
            pSVar7->nOp = pVVar8->nOp;
            pVVar8->aOp = (Op *)0x0;
            pSVar7->aOp = pOVar3;
          }
        }
        else if (local_1c8.zErrMsg != (char *)0x0) {
          sqlite3DbFreeNN(local_1c8.db,local_1c8.zErrMsg);
          local_1c8.nErr = pParse->nErr;
          goto LAB_0018fe13;
        }
        pSVar7->nMem = local_1c8.nMem;
        pSVar7->nCsr = local_1c8.nTab;
        pSVar7->token = pTrigger;
        pTVar6->aColmask[0] = local_1c8.oldmask;
        pTVar6->aColmask[1] = local_1c8.newmask;
        sqlite3VdbeDelete(pVVar8);
      }
      sqlite3ParseObjectReset(&local_1c8);
      goto LAB_0018fe93;
    }
  }
  pTVar6 = (TriggerPrg *)0x0;
LAB_0018fe93:
  pParse->db->errByteOffset = -1;
  return pTVar6;
}

Assistant:

static TriggerPrg *getRowTrigger(
  Parse *pParse,       /* Current parse context */
  Trigger *pTrigger,   /* Trigger to code */
  Table *pTab,         /* The table trigger pTrigger is attached to */
  int orconf           /* ON CONFLICT algorithm. */
){
  Parse *pRoot = sqlite3ParseToplevel(pParse);
  TriggerPrg *pPrg;

  assert( pTrigger->zName==0 || pTab==tableOfTrigger(pTrigger) );

  /* It may be that this trigger has already been coded (or is in the
  ** process of being coded). If this is the case, then an entry with
  ** a matching TriggerPrg.pTrigger field will be present somewhere
  ** in the Parse.pTriggerPrg list. Search for such an entry.  */
  for(pPrg=pRoot->pTriggerPrg;
      pPrg && (pPrg->pTrigger!=pTrigger || pPrg->orconf!=orconf);
      pPrg=pPrg->pNext
  );

  /* If an existing TriggerPrg could not be located, create a new one. */
  if( !pPrg ){
    pPrg = codeRowTrigger(pParse, pTrigger, pTab, orconf);
    pParse->db->errByteOffset = -1;
  }

  return pPrg;
}